

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O0

void cdftocsv::processrec(char *rec)

{
  int local_34;
  float *pfStack_30;
  int bin_index;
  prob_mean *pp;
  int *bin_count;
  char *b;
  damagecdfrec *d;
  char *rec_local;
  
  pfStack_30 = (float *)(rec + 0x10);
  for (local_34 = 0; local_34 < *(int *)(rec + 0xc); local_34 = local_34 + 1) {
    fprintf(_stdout,"%d,%u,%d,%d,%f,%f\n",(double)*pfStack_30,(double)pfStack_30[1],
            (ulong)*(uint *)rec,(ulong)*(uint *)(rec + 4),(ulong)*(uint *)(rec + 8),
            (ulong)(local_34 + 1));
    pfStack_30 = pfStack_30 + 2;
  }
  return;
}

Assistant:

void processrec(char *rec)
	{
		damagecdfrec *d = (damagecdfrec *)rec;
		char *b = rec + sizeof(damagecdfrec);
		int *bin_count = (int *)b;
		b = b + sizeof(int);
		prob_mean *pp = (prob_mean *)b;
		for (int bin_index = 0; bin_index < *bin_count; bin_index++) {
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
			fprintf(stdout, "%d,%llu,%d,%d,%f,%f\n", d->event_id, d->areaperil_id, d->vulnerability_id, bin_index + 1, pp->prob_to, pp->bin_mean);
#else
			fprintf(stdout, "%d,%u,%d,%d,%f,%f\n", d->event_id, d->areaperil_id, d->vulnerability_id, bin_index + 1, pp->prob_to, pp->bin_mean);
#endif
			pp++;
		}
	}